

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::ExtensionSet::Extension::IsInitialized
          (Extension *this,ExtensionSet *ext_set,MessageLite *extendee,int number,Arena *arena)

{
  undefined1 uVar1;
  bool bVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *this_00;
  Nonnull<const_char_*> failure_msg;
  LogMessage *this_01;
  int index;
  RepeatedPtrFieldBase *this_02;
  MessageLite *unaff_R15;
  string_view sVar3;
  string_view str;
  bool was_packed_on_wire;
  ExtensionInfo extension_info;
  GeneratedExtensionFinder finder;
  bool local_59;
  undefined1 local_58 [16];
  anon_union_16_2_0e0aa8cc_for_ExtensionInfo_6 local_48;
  FieldDescriptor *local_38;
  LazyEagerVerifyFnType p_Stack_30;
  GeneratedExtensionFinder local_28;
  
  if (0xed < (byte)(this->type - 0x13)) {
    uVar1 = 1;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4) == 10) {
      if (this->is_repeated == true) {
        this_02 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
        if (0 < this_02->current_size_) {
          index = 0;
          do {
            this_00 = RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                                (this_02,index);
            uVar1 = MessageLite::IsInitialized(this_00);
            if (!(bool)uVar1) {
              return (bool)uVar1;
            }
            index = index + 1;
            this_02 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
          } while (index < this_02->current_size_);
        }
      }
      else if ((this->field_0xa & 2) == 0) {
        if ((this->field_0xa & 4) == 0) {
          bVar2 = MessageLite::IsInitialized(this->field_0);
          return bVar2;
        }
        local_59 = false;
        local_38 = (FieldDescriptor *)0x0;
        p_Stack_30 = (LazyEagerVerifyFnType)0x0;
        local_48.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
        local_48.enum_validity_check.arg = (void *)0x0;
        local_58._0_8_ = (MessageLite *)0x0;
        local_58._8_8_ =
             (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
              )0x0;
        local_28.extendee_ = extendee;
        bVar2 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                          (ext_set,2,number,&local_28,(ExtensionInfo *)local_58,&local_59);
        unaff_R15 = extendee;
        if ((!bVar2) || (local_48.enum_validity_check.func == (EnumValidityFuncWithArg *)0x0))
        goto LAB_00f49cdf;
        uVar1 = (**(code **)(**(long **)&(this->field_0).int32_t_value + 0x50))
                          (*(long **)&(this->field_0).int32_t_value,
                           local_48.enum_validity_check.func,arena);
      }
    }
    return (bool)uVar1;
  }
  IsInitialized();
LAB_00f49cdf:
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                          ((void *)0x0,(void *)0x0,"prototype != nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,0x69d,failure_msg);
  sVar3._M_str = "extendee: ";
  sVar3._M_len = 10;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            ((LogMessage *)local_58,sVar3);
  sVar3 = MessageLite::GetTypeName(unaff_R15);
  this_01 = absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)local_58,sVar3);
  str._M_str = "; number: ";
  str._M_len = 10;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_01,str);
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_01,number);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_58);
}

Assistant:

bool ExtensionSet::Extension::IsInitialized(const ExtensionSet* ext_set,
                                            const MessageLite* extendee,
                                            int number, Arena* arena) const {
  if (cpp_type(type) != WireFormatLite::CPPTYPE_MESSAGE) return true;

  if (is_repeated) {
    for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
      if (!ptr.repeated_message_value->Get(i).IsInitialized()) {
        return false;
      }
    }
    return true;
  }

  if (is_cleared) return true;

  if (!is_lazy) return ptr.message_value->IsInitialized();

  const MessageLite* prototype =
      ext_set->GetPrototypeForLazyMessage(extendee, number);
  ABSL_DCHECK_NE(prototype, nullptr)
      << "extendee: " << extendee->GetTypeName() << "; number: " << number;
  return ptr.lazymessage_value->IsInitialized(prototype, arena);
}